

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * LoadImageFromMemory(Image *__return_storage_ptr__,char *fileType,uchar *fileData,
                           int dataSize)

{
  ushort *puVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  _Bool _Var5;
  char *__src;
  uchar *puVar6;
  float *__ptr;
  void *__dest;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  int comp;
  char fileExtLower [16];
  int local_12c;
  char local_128 [24];
  stbi__context local_110;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = '\0';
  local_128[7] = '\0';
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = '\0';
  local_128[0xb] = '\0';
  local_128[0xc] = '\0';
  local_128[0xd] = '\0';
  local_128[0xe] = '\0';
  local_128[0xf] = '\0';
  __src = TextToLower(fileType);
  strcpy(local_128,__src);
  _Var5 = TextIsEqual(local_128,".png");
  local_110.img_buffer = fileData;
  local_110.img_buffer_original = fileData;
  if ((_Var5) || (_Var5 = TextIsEqual(local_128,".gif"), _Var5)) {
    if (fileData == (uchar *)0x0) {
      return __return_storage_ptr__;
    }
    local_12c = 0;
    local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_110.read_from_callbacks = 0;
    local_110.callback_already_read = 0;
    local_110.img_buffer_end = fileData + dataSize;
    local_110.img_buffer_original_end = local_110.img_buffer_end;
    puVar6 = stbi__load_and_postprocess_8bit
                       (&local_110,&__return_storage_ptr__->width,&__return_storage_ptr__->height,
                        &local_12c,0);
    __return_storage_ptr__->data = puVar6;
    __return_storage_ptr__->mipmaps = 1;
    if (3 < local_12c - 1U) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->format = *(int *)(&DAT_00167980 + (ulong)(local_12c - 1U) * 4);
    return __return_storage_ptr__;
  }
  _Var5 = TextIsEqual(local_128,".hdr");
  if (_Var5) {
    if (fileData == (uchar *)0x0) {
      return __return_storage_ptr__;
    }
    local_12c = 0;
    local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_110.read_from_callbacks = 0;
    local_110.callback_already_read = 0;
    local_110.img_buffer_end = fileData + dataSize;
    local_110.img_buffer_original_end = local_110.img_buffer_end;
    __ptr = stbi__loadf_main(&local_110,&__return_storage_ptr__->width,
                             &__return_storage_ptr__->height,&local_12c,0);
    __return_storage_ptr__->data = __ptr;
    __return_storage_ptr__->mipmaps = 1;
    if (local_12c == 4) {
      __return_storage_ptr__->format = 10;
      return __return_storage_ptr__;
    }
    if (local_12c == 3) {
      __return_storage_ptr__->format = 9;
      return __return_storage_ptr__;
    }
    if (local_12c == 1) {
      __return_storage_ptr__->format = 8;
      return __return_storage_ptr__;
    }
    TraceLog(4,"IMAGE: HDR file format not supported");
    free(__ptr);
    return __return_storage_ptr__;
  }
  _Var5 = TextIsEqual(local_128,".dds");
  if (!_Var5) {
    TraceLog(4,"IMAGE: File format not supported");
    return __return_storage_ptr__;
  }
  if (fileData == (uchar *)0x0) {
LAB_0013d29c:
    iVar12 = 0;
    iVar8 = 0;
    iVar13 = 0;
  }
  else {
    if ((((*fileData != 'D') || (fileData[1] != 'D')) || (fileData[2] != 'S')) ||
       (fileData[3] != ' ')) {
      TraceLog(4,"IMAGE: DDS file data not valid");
      goto LAB_0013d29c;
    }
    puVar6 = fileData + 0x80;
    iVar8 = *(int *)(fileData + 0xc);
    uVar9 = *(uint *)(fileData + 0x1c);
    iVar13 = uVar9 + (uVar9 == 0);
    iVar12 = *(int *)(fileData + 0x10);
    iVar10 = *(int *)(fileData + 0x58);
    uVar3 = *(uint *)(fileData + 0x50);
    if (iVar10 == 0x10) {
      if (uVar3 == 0x40) {
        sVar11 = (size_t)(iVar8 * iVar12 * 2);
        __dest = malloc(sVar11);
        memcpy(__dest,puVar6,sVar11);
        iVar10 = 3;
        goto LAB_0013d2a7;
      }
      if (uVar3 == 0x41) {
        if (*(int *)(fileData + 0x68) == 0x8000) {
          uVar9 = iVar8 * iVar12;
          __dest = malloc((long)(int)(uVar9 * 2));
          memcpy(__dest,puVar6,(long)(int)(uVar9 * 2));
          iVar10 = 5;
          if (0 < (int)uVar9) {
            uVar7 = 0;
            do {
              puVar1 = (ushort *)((long)__dest + uVar7 * 2);
              *puVar1 = *puVar1 << 1 | (ushort)((short)*puVar1 < 0);
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
          }
          goto LAB_0013d2a7;
        }
        if (*(int *)(fileData + 0x68) == 0xf000) {
          uVar9 = iVar8 * iVar12;
          __dest = malloc((long)(int)(uVar9 * 2));
          memcpy(__dest,puVar6,(long)(int)(uVar9 * 2));
          iVar10 = 6;
          if (0 < (int)uVar9) {
            uVar7 = 0;
            do {
              puVar1 = (ushort *)((long)__dest + uVar7 * 2);
              *puVar1 = *puVar1 << 4 | *puVar1 >> 0xc;
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
          }
          goto LAB_0013d2a7;
        }
      }
    }
    else {
      if (iVar10 == 0x18 && uVar3 == 0x40) {
        sVar11 = (size_t)(iVar8 * iVar12 * 3);
        __dest = malloc(sVar11);
        memcpy(__dest,puVar6,sVar11);
        iVar10 = 4;
        goto LAB_0013d2a7;
      }
      if (iVar10 == 0x20 && uVar3 == 0x41) {
        uVar9 = iVar8 * iVar12 * 4;
        __dest = malloc((long)(int)uVar9);
        memcpy(__dest,puVar6,(long)(int)uVar9);
        iVar10 = 7;
        if (0 < iVar8 * iVar12) {
          uVar7 = 0;
          do {
            uVar2 = *(undefined1 *)((long)__dest + uVar7);
            *(undefined1 *)((long)__dest + uVar7) = *(undefined1 *)((long)__dest + uVar7 + 2);
            *(undefined1 *)((long)__dest + uVar7 + 2) = uVar2;
            uVar7 = uVar7 + 4;
          } while (uVar7 < uVar9);
        }
        goto LAB_0013d2a7;
      }
      if ((uVar3 & 0xfffffffe) == 4) {
        iVar4 = *(int *)(fileData + 0x54);
        iVar10 = 0;
        if (iVar4 == 0) {
          __dest = (void *)0x0;
        }
        else {
          sVar11 = (size_t)(*(int *)(fileData + 0x14) << (1 < uVar9));
          __dest = malloc(sVar11);
          memcpy(__dest,puVar6,sVar11);
          if (iVar4 == 0x31545844) {
            iVar10 = (uVar3 != 4) + 0xb;
          }
          else if (iVar4 == 0x33545844) {
            iVar10 = 0xd;
          }
          else if (iVar4 == 0x35545844) {
            iVar10 = 0xe;
          }
        }
        goto LAB_0013d2a7;
      }
    }
  }
  __dest = (void *)0x0;
  iVar10 = 0;
LAB_0013d2a7:
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->width = iVar12;
  __return_storage_ptr__->height = iVar8;
  __return_storage_ptr__->mipmaps = iVar13;
  __return_storage_ptr__->format = iVar10;
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageFromMemory(const char *fileType, const unsigned char *fileData, int dataSize)
{
    Image image = { 0 };

    char fileExtLower[16] = { 0 };
    strcpy(fileExtLower, TextToLower(fileType));

#if defined(SUPPORT_FILEFORMAT_PNG)
    if ((TextIsEqual(fileExtLower, ".png"))
#else
    if ((false)
#endif
#if defined(SUPPORT_FILEFORMAT_BMP)
        || (TextIsEqual(fileExtLower, ".bmp"))
#endif
#if defined(SUPPORT_FILEFORMAT_TGA)
        || (TextIsEqual(fileExtLower, ".tga"))
#endif
#if defined(SUPPORT_FILEFORMAT_JPG)
        || (TextIsEqual(fileExtLower, ".jpg") ||
            TextIsEqual(fileExtLower, ".jpeg"))
#endif
#if defined(SUPPORT_FILEFORMAT_GIF)
        || (TextIsEqual(fileExtLower, ".gif"))
#endif
#if defined(SUPPORT_FILEFORMAT_PIC)
        || (TextIsEqual(fileExtLower, ".pic"))
#endif
#if defined(SUPPORT_FILEFORMAT_PSD)
        || (TextIsEqual(fileExtLower, ".psd"))
#endif
       )
    {
#if defined(STBI_REQUIRED)
        // NOTE: Using stb_image to load images (Supports multiple image formats)

        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_load_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_GRAYSCALE;
            else if (comp == 2) image.format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
        }
#endif
    }
#if defined(SUPPORT_FILEFORMAT_HDR)
    else if (TextIsEqual(fileExtLower, ".hdr"))
    {
#if defined(STBI_REQUIRED)
        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_loadf_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_R32;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32A32;
            else
            {
                TRACELOG(LOG_WARNING, "IMAGE: HDR file format not supported");
                UnloadImage(image);
            }
        }
#endif
    }
#endif
#if defined(SUPPORT_FILEFORMAT_DDS)
    else if (TextIsEqual(fileExtLower, ".dds")) image = LoadDDS(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PKM)
    else if (TextIsEqual(fileExtLower, ".pkm")) image = LoadPKM(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_KTX)
    else if (TextIsEqual(fileExtLower, ".ktx")) image = LoadKTX(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PVR)
    else if (TextIsEqual(fileExtLower, ".pvr")) image = LoadPVR(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_ASTC)
    else if (TextIsEqual(fileExtLower, ".astc")) image = LoadASTC(fileData, dataSize);
#endif
    else TRACELOG(LOG_WARNING, "IMAGE: File format not supported");

    return image;
}